

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_EnvelopePhase6(opm_t *chip)

{
  uint32_t slot;
  opm_t *chip_local;
  
  chip->eg_serial_bit = (byte)(chip->eg_serial >> 9) & 1;
  if (chip->cycles == 3) {
    chip->eg_serial = chip->eg_out[0] ^ 0x3ff;
  }
  else {
    chip->eg_serial = chip->eg_serial << 1;
  }
  chip->eg_out[1] = chip->eg_out[0];
  return;
}

Assistant:

static void OPM_EnvelopePhase6(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 28) % 32;
    chip->eg_serial_bit = (chip->eg_serial >> 9) & 1;
    if (chip->cycles == 3)
    {
        chip->eg_serial = chip->eg_out[0] ^ 1023;
    }
    else
    {
        chip->eg_serial <<= 1;
    }

    chip->eg_out[1] = chip->eg_out[0];
}